

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_21;
  int t;
  int sequence_length;
  ostringstream error_message_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  smoothed_static_parameters_1;
  vector<double,_std::allocator<double>_> tmp_2;
  int size;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  variance_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  ostringstream error_message_19;
  NonrecursiveMaximumLikelihoodParameterGeneration generation_1;
  ostringstream error_message_18;
  vector<double,_std::allocator<double>_> smoothed_static_parameters;
  ostringstream error_message_17;
  RecursiveMaximumLikelihoodParameterGeneration generation;
  ostringstream error_message_16;
  InputSourcePreprocessing preprocessed_source;
  InputSourceFromStream input_source;
  int read_size;
  int static_size;
  istream *input_stream;
  ostringstream error_message_15;
  ifstream ifs;
  ostringstream error_message_14;
  char *input_file;
  ostringstream error_message_13;
  int num_input_files;
  ostringstream error_message_12;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_11;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> coefficients_3;
  ostringstream error_message_9;
  vector<double,_std::allocator<double>_> coefficients_2;
  int n;
  ostringstream error_message_8;
  double coefficient_1;
  vector<double,_std::allocator<double>_> coefficients_1;
  ostringstream error_message_7;
  ifstream ifs_1;
  ostringstream error_message_6;
  ostringstream error_message_5;
  double coefficient;
  vector<double,_std::allocator<double>_> coefficients;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int tmp;
  int max;
  int min;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  option long_options [2];
  Modes mode;
  bool is_magic_number_specified;
  double magic_number;
  bool is_regression_specified;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  InputFormats input_format;
  int num_past_frame;
  int num_order;
  option *in_stack_ffffffffffffcff8;
  RecursiveMaximumLikelihoodParameterGeneration *in_stack_ffffffffffffd000;
  allocator *paVar6;
  int in_stack_ffffffffffffd008;
  undefined4 in_stack_ffffffffffffd00c;
  InputSourceFromStream *in_stack_ffffffffffffd010;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd018;
  int in_stack_ffffffffffffd020;
  undefined4 in_stack_ffffffffffffd024;
  allocator_type *in_stack_ffffffffffffd028;
  InputSourcePreprocessing *in_stack_ffffffffffffd030;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffd038;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffd040;
  int in_stack_ffffffffffffd04c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd050;
  RecursiveMaximumLikelihoodParameterGeneration *in_stack_ffffffffffffd058;
  undefined7 in_stack_ffffffffffffd060;
  undefined1 in_stack_ffffffffffffd067;
  InputSourceInterface *in_stack_ffffffffffffd098;
  undefined4 in_stack_ffffffffffffd0a0;
  char *pcVar7;
  undefined7 in_stack_ffffffffffffd0b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffd0b8;
  NonrecursiveMaximumLikelihoodParameterGeneration *in_stack_ffffffffffffd0c0;
  undefined7 in_stack_ffffffffffffd0c8;
  byte in_stack_ffffffffffffd0cf;
  char *local_2f10;
  byte local_2ed2;
  bool local_2e71;
  byte local_2e62;
  ostringstream *in_stack_ffffffffffffd1e8;
  undefined6 in_stack_ffffffffffffd1f0;
  byte in_stack_ffffffffffffd1f6;
  undefined1 in_stack_ffffffffffffd1f7;
  bool local_2df1;
  byte local_2d9a;
  bool local_2d72;
  bool local_2d4a;
  bool local_2d2a;
  allocator local_2d09;
  string local_2d08 [32];
  ostringstream local_2ce8 [380];
  int local_2b6c;
  int local_2b68;
  undefined1 local_2b61 [33];
  ostringstream local_2b40 [376];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_29c8;
  undefined1 local_29a9 [17];
  double *local_2998;
  undefined1 local_2971 [9];
  double *local_2968;
  double *local_2960;
  allocator_type local_2940 [28];
  int local_2924;
  allocator local_28e9;
  string local_28e8 [32];
  ostringstream local_28c8 [376];
  NonrecursiveMaximumLikelihoodParameterGeneration local_2750;
  allocator local_2709;
  string local_2708 [32];
  ostringstream local_26e8 [415];
  allocator local_2549;
  string local_2548 [32];
  ostringstream local_2528 [376];
  RecursiveMaximumLikelihoodParameterGeneration local_23b0;
  allocator local_22c1;
  string local_22c0 [32];
  ostringstream local_22a0 [408];
  InputSourceFromStream local_2108;
  int local_20e8;
  int local_20e4;
  char *local_20e0;
  allocator local_20d1;
  string local_20d0 [32];
  ostringstream local_20b0 [376];
  char local_1f38 [527];
  allocator local_1d29;
  string local_1d28 [32];
  ostringstream local_1d08 [376];
  char *local_1b90;
  allocator local_1b81;
  string local_1b80 [32];
  ostringstream local_1b60 [376];
  int local_19e8;
  allocator local_19e1;
  string local_19e0 [32];
  ostringstream local_19c0 [383];
  allocator local_1841;
  string local_1840 [32];
  int local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  allocator local_1811;
  string local_1810 [32];
  ostringstream local_17f0 [383];
  allocator local_1671;
  string local_1670 [39];
  allocator local_1649;
  string local_1648 [32];
  ostringstream local_1628 [405];
  byte local_1493;
  byte local_1492;
  allocator local_1491;
  string local_1490 [39];
  allocator local_1469;
  string local_1468 [32];
  ostringstream local_1448 [383];
  allocator local_12c9;
  string local_12c8 [63];
  allocator local_1289;
  string local_1288 [32];
  ostringstream local_1268 [415];
  allocator local_10c9;
  string local_10c8 [32];
  ostringstream local_10a8 [376];
  char local_f30 [527];
  allocator local_d21;
  string local_d20 [32];
  ostringstream local_d00 [381];
  byte local_b83;
  byte local_b82;
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [32];
  ostringstream local_b38 [383];
  allocator local_9b9;
  string local_9b8 [71];
  allocator local_971;
  string local_970 [32];
  ostringstream local_950 [383];
  allocator local_7d1;
  string local_7d0 [32];
  ostringstream local_7b0 [383];
  allocator local_631;
  string local_630 [32];
  int local_610;
  undefined4 local_60c;
  undefined4 local_608;
  allocator local_601;
  string local_600 [32];
  ostringstream local_5e0 [383];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  ostringstream local_418 [383];
  allocator local_299;
  string local_298 [32];
  int local_278;
  allocator local_271;
  string local_270 [32];
  ostringstream local_250 [383];
  allocator local_d1;
  string local_d0 [52];
  int local_9c;
  undefined1 local_98 [72];
  int local_50;
  byte local_49;
  undefined8 local_48;
  byte local_39;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_38;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 0x1e;
  local_1c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1038af);
  local_39 = 0;
  local_48 = 0;
  local_49 = 0;
  local_50 = 0;
  memcpy(local_98,&PTR_anon_var_dwarf_3018_0013aa10,0x40);
  local_2df1 = (bool)in_stack_ffffffffffffd1f6;
LAB_001038ef:
  while (local_9c = ya_getopt_long_only((int)((ulong)in_stack_ffffffffffffd010 >> 0x20),
                                        (char **)CONCAT44(in_stack_ffffffffffffd00c,
                                                          in_stack_ffffffffffffd008),
                                        (char *)in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8,
                                        (int *)0x103917), pcVar7 = ya_optarg, local_9c != -1) {
    if (local_9c == 0x44) {
      if ((local_39 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_d00);
        std::operator<<((ostream *)local_d00,
                        "-D and -r options cannot be specified at the same time");
        paVar6 = &local_d21;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d20,"mlpg",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)
                           ),(ostringstream *)paVar6);
        std::__cxx11::string::~string(local_d20);
        std::allocator<char>::~allocator((allocator<char> *)&local_d21);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_d00);
        goto LAB_00106d07;
      }
      std::ifstream::ifstream(local_f30);
      pcVar7 = ya_optarg;
      std::operator|(_S_in,_S_bin);
      std::ifstream::open(local_f30,(_Ios_Openmode)pcVar7);
      bVar2 = std::ios::fail();
      if ((bVar2 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x104c50);
        while (bVar1 = sptk::ReadStream<double>
                                 ((double *)
                                  CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                                  (istream *)in_stack_ffffffffffffd000), bVar1) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010,
                     (value_type *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008));
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)in_stack_ffffffffffffd010,
                    (value_type *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008));
        local_278 = 4;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_10a8);
        poVar5 = std::operator<<((ostream *)local_10a8,"Cannot open file ");
        std::operator<<(poVar5,ya_optarg);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_10c8,"mlpg",&local_10c9);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)
                           ),in_stack_ffffffffffffd1e8);
        std::__cxx11::string::~string(local_10c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_10a8);
      }
      std::ifstream::~ifstream(local_f30);
joined_r0x0010491b:
      if (local_278 != 4) goto LAB_00106d07;
    }
    else if (local_9c == 0x52) {
      local_1818 = 0;
      local_181c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1840,pcVar7,&local_1841);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                         (int *)in_stack_ffffffffffffd000);
      local_2ed2 = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_1820,0,1);
        local_2ed2 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_1840);
      std::allocator<char>::~allocator((allocator<char> *)&local_1841);
      if ((local_2ed2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_19c0);
        poVar5 = std::operator<<((ostream *)local_19c0,
                                 "The argument for the -R option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_19e0,"mlpg",&local_19e1);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)
                           ),in_stack_ffffffffffffd1e8);
        std::__cxx11::string::~string(local_19e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_19e1);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_19c0);
        goto LAB_00106d07;
      }
      local_50 = local_1820;
    }
    else {
      if (local_9c == 100) {
        if ((local_39 & 1) == 0) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)0x10450a);
          pcVar7 = ya_optarg;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_9b8,pcVar7,&local_9b9);
          bVar1 = sptk::ConvertStringToDouble
                            ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008)
                             ,(double *)in_stack_ffffffffffffd000);
          std::__cxx11::string::~string(local_9b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010,
                       (value_type *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008));
            while( true ) {
              local_b82 = 0;
              local_b83 = 0;
              local_2df1 = false;
              if (ya_optind < local_8) {
                pcVar7 = *(char **)(local_10 + (long)ya_optind * 8);
                std::allocator<char>::allocator();
                local_b82 = 1;
                std::__cxx11::string::string(local_b80,pcVar7,&local_b81);
                local_b83 = 1;
                in_stack_ffffffffffffd1f7 =
                     sptk::ConvertStringToDouble
                               ((string *)
                                CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                                (double *)in_stack_ffffffffffffd000);
                local_2df1 = (bool)in_stack_ffffffffffffd1f7;
              }
              if ((local_b83 & 1) != 0) {
                std::__cxx11::string::~string(local_b80);
              }
              if ((local_b82 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_b81);
              }
              if ((local_2df1 & 1U) == 0) break;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010,
                         (value_type *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008)
                        );
              ya_optind = ya_optind + 1;
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffd010,
                        (value_type *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008))
            ;
            local_278 = 4;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_b38);
            std::operator<<((ostream *)local_b38,"The argument for the -d option must be numeric");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b58,"mlpg",&local_b59);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffd1f7,
                                CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                       in_stack_ffffffffffffd1e8);
            std::__cxx11::string::~string(local_b58);
            std::allocator<char>::~allocator((allocator<char> *)&local_b59);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_b38);
          }
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
          goto joined_r0x0010491b;
        }
        std::__cxx11::ostringstream::ostringstream(local_950);
        std::operator<<((ostream *)local_950,
                        "-d and -r options cannot be specified at the same time");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_970,"mlpg",&local_971);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)
                           ),in_stack_ffffffffffffd1e8);
        std::__cxx11::string::~string(local_970);
        std::allocator<char>::~allocator((allocator<char> *)&local_971);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_950);
        goto LAB_00106d07;
      }
      if (local_9c == 0x68) {
        anon_unknown.dwarf_2ebd::PrintUsage
                  ((ostream *)CONCAT17(in_stack_ffffffffffffd067,in_stack_ffffffffffffd060));
        local_4 = 0;
        local_278 = 1;
        goto LAB_00106d07;
      }
      if (local_9c == 0x6c) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,pcVar7,&local_d1);
        bVar1 = sptk::ConvertStringToInteger
                          ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                           (int *)in_stack_ffffffffffffd000);
        local_2d2a = !bVar1 || local_14 < 1;
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        if (local_2d2a) {
          std::__cxx11::ostringstream::ostringstream(local_250);
          std::operator<<((ostream *)local_250,
                          "The argument for the -l option must be a positive integer");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_270,"mlpg",&local_271);
          sptk::PrintErrorMessage
                    ((string *)
                     CONCAT17(in_stack_ffffffffffffd1f7,
                              CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                     in_stack_ffffffffffffd1e8);
          std::__cxx11::string::~string(local_270);
          std::allocator<char>::~allocator((allocator<char> *)&local_271);
          local_4 = 1;
          local_278 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_250);
          goto LAB_00106d07;
        }
        local_14 = local_14 + -1;
      }
      else {
        if (local_9c == 0x6d) goto LAB_00103c57;
        if (local_9c == 0x71) {
          local_608 = 0;
          local_60c = 2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_630,pcVar7,&local_631);
          bVar1 = sptk::ConvertStringToInteger
                            ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008)
                             ,(int *)in_stack_ffffffffffffd000);
          local_2d9a = 1;
          if (bVar1) {
            bVar1 = sptk::IsInRange(local_610,0,2);
            local_2d9a = bVar1 ^ 0xff;
          }
          std::__cxx11::string::~string(local_630);
          std::allocator<char>::~allocator((allocator<char> *)&local_631);
          if ((local_2d9a & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_7b0);
            poVar5 = std::operator<<((ostream *)local_7b0,
                                     "The argument for the -q option must be an integer ");
            poVar5 = std::operator<<(poVar5,"in the range of ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
            poVar5 = std::operator<<(poVar5," to ");
            std::ostream::operator<<(poVar5,2);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_7d0,"mlpg",&local_7d1);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffd1f7,
                                CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                       in_stack_ffffffffffffd1e8);
            std::__cxx11::string::~string(local_7d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_7b0);
            goto LAB_00106d07;
          }
          local_1c = local_610;
        }
        else if (local_9c == 0x72) {
          if ((local_39 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_1268);
            std::operator<<((ostream *)local_1268,"-r option cannot be specified multiple times");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1288,"mlpg",&local_1289);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffd1f7,
                                CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                       in_stack_ffffffffffffd1e8);
            std::__cxx11::string::~string(local_1288);
            std::allocator<char>::~allocator((allocator<char> *)&local_1289);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1268);
            goto LAB_00106d07;
          }
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)0x104e52);
          pcVar7 = ya_optarg;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_12c8,pcVar7,&local_12c9);
          bVar1 = sptk::ConvertStringToInteger
                            ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008)
                             ,(int *)in_stack_ffffffffffffd000);
          local_2e62 = 1;
          if (bVar1) {
            bVar1 = sptk::ComputeFirstOrderRegressionCoefficients
                              (in_stack_ffffffffffffd020,in_stack_ffffffffffffd018);
            local_2e62 = bVar1 ^ 0xff;
          }
          std::__cxx11::string::~string(local_12c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
          if ((local_2e62 & 1) == 0) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffd010,
                        (value_type *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008))
            ;
            local_278 = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1448);
            std::operator<<((ostream *)local_1448,
                            "The argument for the -r option must be positive integer(s)");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1468,"mlpg",&local_1469);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffd1f7,
                                CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                       in_stack_ffffffffffffd1e8);
            std::__cxx11::string::~string(local_1468);
            std::allocator<char>::~allocator((allocator<char> *)&local_1469);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1448);
          }
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
          if (local_278 != 0) goto LAB_00106d07;
          local_1492 = 0;
          local_1493 = 0;
          local_2e71 = false;
          if (ya_optind < local_8) {
            pcVar7 = *(char **)(local_10 + (long)ya_optind * 8);
            std::allocator<char>::allocator();
            local_1492 = 1;
            std::__cxx11::string::string(local_1490,pcVar7,&local_1491);
            local_1493 = 1;
            local_2e71 = sptk::ConvertStringToInteger
                                   ((string *)
                                    CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                                    (int *)in_stack_ffffffffffffd000);
          }
          if ((local_1493 & 1) != 0) {
            std::__cxx11::string::~string(local_1490);
          }
          if ((local_1492 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_1491);
          }
          if (local_2e71 != false) {
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x105217);
            bVar1 = sptk::ComputeSecondOrderRegressionCoefficients
                              (in_stack_ffffffffffffd020,in_stack_ffffffffffffd018);
            if (bVar1) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)in_stack_ffffffffffffd010,
                          (value_type *)
                          CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008));
              ya_optind = ya_optind + 1;
              local_278 = 0;
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_1628);
              std::operator<<((ostream *)local_1628,
                              "The argument for the -r option must be positive integer(s)");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1648,"mlpg",&local_1649);
              sptk::PrintErrorMessage
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffd1f7,
                                  CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                         in_stack_ffffffffffffd1e8);
              std::__cxx11::string::~string(local_1648);
              std::allocator<char>::~allocator((allocator<char> *)&local_1649);
              local_4 = 1;
              local_278 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1628);
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
            if (local_278 != 0) goto LAB_00106d07;
          }
          local_39 = 1;
        }
        else if (local_9c == 0x73) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_460,pcVar7,&local_461);
          bVar1 = sptk::ConvertStringToInteger
                            ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008)
                             ,(int *)in_stack_ffffffffffffd000);
          local_2d72 = !bVar1 || local_18 < 0;
          std::__cxx11::string::~string(local_460);
          std::allocator<char>::~allocator((allocator<char> *)&local_461);
          if (local_2d72) {
            std::__cxx11::ostringstream::ostringstream(local_5e0);
            poVar5 = std::operator<<((ostream *)local_5e0,
                                     "The argument for the -s option must be a ");
            std::operator<<(poVar5,"non-negative integer");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_600,"mlpg",&local_601);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffd1f7,
                                CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                       in_stack_ffffffffffffd1e8);
            std::__cxx11::string::~string(local_600);
            std::allocator<char>::~allocator((allocator<char> *)&local_601);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_5e0);
            goto LAB_00106d07;
          }
        }
        else {
          if (local_9c != 1000) {
            anon_unknown.dwarf_2ebd::PrintUsage
                      ((ostream *)CONCAT17(in_stack_ffffffffffffd067,in_stack_ffffffffffffd060));
            local_4 = 1;
            local_278 = 1;
            goto LAB_00106d07;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1670,pcVar7,&local_1671);
          bVar1 = sptk::ConvertStringToDouble
                            ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008)
                             ,(double *)in_stack_ffffffffffffd000);
          std::__cxx11::string::~string(local_1670);
          std::allocator<char>::~allocator((allocator<char> *)&local_1671);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_17f0);
            std::operator<<((ostream *)local_17f0,
                            "The argument for the -magic option must be a number");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1810,"mlpg",&local_1811);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffd1f7,
                                CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                       in_stack_ffffffffffffd1e8);
            std::__cxx11::string::~string(local_1810);
            std::allocator<char>::~allocator((allocator<char> *)&local_1811);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_17f0);
            goto LAB_00106d07;
          }
          local_49 = 1;
        }
      }
    }
  }
  local_19e8 = local_8 - ya_optind;
  if (1 < local_19e8) {
    std::__cxx11::ostringstream::ostringstream(local_1b60);
    std::operator<<((ostream *)local_1b60,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b80,"mlpg",&local_1b81);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
               in_stack_ffffffffffffd1e8);
    std::__cxx11::string::~string(local_1b80);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b81);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1b60);
    goto LAB_00106d07;
  }
  if (local_19e8 == 0) {
    local_2f10 = (char *)0x0;
  }
  else {
    local_2f10 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_1b90 = local_2f10;
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1d08);
    std::operator<<((ostream *)local_1d08,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d28,"mlpg",&local_1d29);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
               in_stack_ffffffffffffd1e8);
    std::__cxx11::string::~string(local_1d28);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d29);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d08);
    goto LAB_00106d07;
  }
  std::ifstream::ifstream(local_1f38);
  pcVar7 = local_1b90;
  if (local_1b90 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1f38,(_Ios_Openmode)pcVar7);
    in_stack_ffffffffffffd0cf = std::ios::fail();
    if ((in_stack_ffffffffffffd0cf & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_20b0);
      poVar5 = std::operator<<((ostream *)local_20b0,"Cannot open file ");
      std::operator<<(poVar5,local_1b90);
      paVar6 = &local_20d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20d0,"mlpg",paVar6);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                 in_stack_ffffffffffffd1e8);
      std::__cxx11::string::~string(local_20d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_20d1);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_20b0);
      goto LAB_00106ce9;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    pcVar7 = (char *)&std::cin;
  }
  else {
    pcVar7 = local_1f38;
  }
  iVar3 = local_14 + 1;
  local_20e4 = iVar3;
  local_20e0 = pcVar7;
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&local_38);
  local_20e8 = iVar3 * ((int)sVar4 + 1) * 2;
  sptk::InputSourceFromStream::InputSourceFromStream
            (in_stack_ffffffffffffd010,SUB41((uint)in_stack_ffffffffffffd00c >> 0x18,0),
             in_stack_ffffffffffffd008,(istream *)in_stack_ffffffffffffd000);
  anon_unknown.dwarf_2ebd::InputSourcePreprocessing::InputSourcePreprocessing
            (in_stack_ffffffffffffd030,(InputFormats)((ulong)in_stack_ffffffffffffd028 >> 0x20),
             (InputSourceInterface *)CONCAT44(in_stack_ffffffffffffd024,in_stack_ffffffffffffd020));
  if (local_50 == 0) {
    if ((local_49 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_22a0);
      std::operator<<((ostream *)local_22a0,"Magic number is not supported on recursive mode");
      paVar6 = &local_22c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_22c0,"mlpg",paVar6);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
                 in_stack_ffffffffffffd1e8);
      std::__cxx11::string::~string(local_22c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_22c1);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_22a0);
      goto LAB_00106cb1;
    }
    sptk::RecursiveMaximumLikelihoodParameterGeneration::
    RecursiveMaximumLikelihoodParameterGeneration
              ((RecursiveMaximumLikelihoodParameterGeneration *)
               CONCAT17(bVar2,in_stack_ffffffffffffd0b0),(int)((ulong)pcVar7 >> 0x20),(int)pcVar7,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT44(iVar3,in_stack_ffffffffffffd0a0),in_stack_ffffffffffffd098);
    bVar1 = sptk::RecursiveMaximumLikelihoodParameterGeneration::IsValid(&local_23b0);
    if (bVar1) {
      std::allocator<double>::allocator((allocator<double> *)0x10624e);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffd024,in_stack_ffffffffffffd020),
                 (size_type)in_stack_ffffffffffffd018,(allocator_type *)in_stack_ffffffffffffd010);
      std::allocator<double>::~allocator((allocator<double> *)0x10627a);
      goto LAB_0010627a;
    }
    std::__cxx11::ostringstream::ostringstream(local_2528);
    std::operator<<((ostream *)local_2528,
                    "Failed to initialize RecursiveMaximumLikelihoodParameterGeneration");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2548,"mlpg",&local_2549);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
               in_stack_ffffffffffffd1e8);
    std::__cxx11::string::~string(local_2548);
    std::allocator<char>::~allocator((allocator<char> *)&local_2549);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_2528);
    goto LAB_00106446;
  }
  if (local_50 != 1) goto LAB_00106c9b;
  sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
  NonrecursiveMaximumLikelihoodParameterGeneration
            (in_stack_ffffffffffffd0c0,(int)((ulong)in_stack_ffffffffffffd0b8 >> 0x20),
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)CONCAT17(bVar2,in_stack_ffffffffffffd0b0),SUB81((ulong)pcVar7 >> 0x38,0),
             (double)CONCAT44(iVar3,in_stack_ffffffffffffd0a0));
  bVar1 = sptk::NonrecursiveMaximumLikelihoodParameterGeneration::IsValid(&local_2750);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_28c8);
    poVar5 = std::operator<<((ostream *)local_28c8,"Failed to initialize ");
    std::operator<<(poVar5,"NonrecursiveMaximumLikelihoodParameterGeneration");
    paVar6 = &local_28e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28e8,"mlpg",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
               in_stack_ffffffffffffd1e8);
    std::__cxx11::string::~string(local_28e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_28e9);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_28c8);
    goto LAB_00106c47;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x106642);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x10664f);
  iVar3 = sptk::InputSourceFromStream::GetSize(&local_2108);
  local_2924 = iVar3 / 2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106682);
  while (bVar1 = sptk::InputSourceFromStream::Get
                           ((InputSourceFromStream *)
                            CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                            (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd000),
        bVar1) {
    in_stack_ffffffffffffd038._M_current = (double *)local_2940;
    local_2960 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcff8);
    local_2971._1_8_ =
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcff8);
    local_2968 = (double *)
                 __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                           (difference_type)in_stack_ffffffffffffd000);
    in_stack_ffffffffffffd040._M_current = (double *)local_2971;
    std::allocator<double>::allocator((allocator<double> *)0x106705);
    std::vector<double,std::allocator<double>>::
    vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd030,
               in_stack_ffffffffffffd040,in_stack_ffffffffffffd038,in_stack_ffffffffffffd028);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_ffffffffffffd000,(value_type *)in_stack_ffffffffffffcff8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
    std::allocator<double>::~allocator((allocator<double> *)0x10675a);
    in_stack_ffffffffffffd028 = local_2940;
    local_29a9._9_8_ =
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcff8);
    local_2998 = (double *)
                 __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                           (difference_type)in_stack_ffffffffffffd000);
    local_29a9._1_8_ =
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcff8);
    in_stack_ffffffffffffd030 = (InputSourcePreprocessing *)local_29a9;
    std::allocator<double>::allocator((allocator<double> *)0x1067b5);
    std::vector<double,std::allocator<double>>::
    vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd030,
               in_stack_ffffffffffffd040,in_stack_ffffffffffffd038,in_stack_ffffffffffffd028);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_ffffffffffffd000,(value_type *)in_stack_ffffffffffffcff8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
    std::allocator<double>::~allocator((allocator<double> *)0x10680a);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1068f2);
  bVar1 = sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
                    ((NonrecursiveMaximumLikelihoodParameterGeneration *)
                     CONCAT17(in_stack_ffffffffffffd0cf,in_stack_ffffffffffffd0c8),
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_ffffffffffffd0c0,in_stack_ffffffffffffd0b8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)CONCAT17(bVar2,in_stack_ffffffffffffd0b0));
  if (bVar1) {
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&local_29c8);
    local_2b68 = (int)sVar4;
    for (local_2b6c = 0; local_2b6c < local_2b68; local_2b6c = local_2b6c + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_29c8,(long)local_2b6c);
      bVar1 = sptk::WriteStream<double>
                        ((int)in_stack_ffffffffffffd050,iVar3,
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_ffffffffffffd040._M_current,
                         (ostream *)in_stack_ffffffffffffd038._M_current,
                         (int *)in_stack_ffffffffffffd030);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_2ce8);
        std::operator<<((ostream *)local_2ce8,"Failed to write static parameters");
        paVar6 = &local_2d09;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d08,"mlpg",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)
                           ),in_stack_ffffffffffffd1e8);
        std::__cxx11::string::~string(local_2d08);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d09);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_2ce8);
        goto LAB_00106c20;
      }
    }
    local_278 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_2b40);
    std::operator<<((ostream *)local_2b40,"Failed to perform MLPG");
    in_stack_ffffffffffffd010 = (InputSourceFromStream *)local_2b61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_2b61 + 1),"mlpg",(allocator *)in_stack_ffffffffffffd010);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
               in_stack_ffffffffffffd1e8);
    std::__cxx11::string::~string((string *)(local_2b61 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2b61);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_2b40);
  }
LAB_00106c20:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffd010);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffd010);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffd010);
LAB_00106c47:
  sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
  ~NonrecursiveMaximumLikelihoodParameterGeneration
            ((NonrecursiveMaximumLikelihoodParameterGeneration *)0x106c54);
  goto joined_r0x0010645c;
LAB_00103c57:
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,pcVar7,&local_299);
  bVar1 = sptk::ConvertStringToInteger
                    ((string *)CONCAT44(in_stack_ffffffffffffd00c,in_stack_ffffffffffffd008),
                     (int *)in_stack_ffffffffffffd000);
  local_2d4a = !bVar1 || local_14 < 0;
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  if (local_2d4a) goto LAB_00103d1c;
  goto LAB_001038ef;
LAB_00103d1c:
  std::__cxx11::ostringstream::ostringstream(local_418);
  poVar5 = std::operator<<((ostream *)local_418,"The argument for the -m option must be a ");
  std::operator<<(poVar5,"non-negative integer");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"mlpg",&local_439);
  sptk::PrintErrorMessage
            ((string *)
             CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
             in_stack_ffffffffffffd1e8);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  local_4 = 1;
  local_278 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_418);
  goto LAB_00106d07;
  while (bVar1 = sptk::WriteStream<double>
                           ((int)in_stack_ffffffffffffd050,in_stack_ffffffffffffd04c,
                            (vector<double,_std::allocator<double>_> *)
                            in_stack_ffffffffffffd040._M_current,
                            (ostream *)in_stack_ffffffffffffd038._M_current,
                            (int *)in_stack_ffffffffffffd030), bVar1) {
LAB_0010627a:
    bVar1 = sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
                      (in_stack_ffffffffffffd058,in_stack_ffffffffffffd050);
    if (!bVar1) {
      local_278 = 0;
      goto LAB_00106439;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_26e8);
  std::operator<<((ostream *)local_26e8,"Failed to write static parameters");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2708,"mlpg",&local_2709);
  sptk::PrintErrorMessage
            ((string *)
             CONCAT17(in_stack_ffffffffffffd1f7,CONCAT16(local_2df1,in_stack_ffffffffffffd1f0)),
             in_stack_ffffffffffffd1e8);
  std::__cxx11::string::~string(local_2708);
  std::allocator<char>::~allocator((allocator<char> *)&local_2709);
  local_4 = 1;
  local_278 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_26e8);
LAB_00106439:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd010);
LAB_00106446:
  sptk::RecursiveMaximumLikelihoodParameterGeneration::
  ~RecursiveMaximumLikelihoodParameterGeneration(in_stack_ffffffffffffd000);
joined_r0x0010645c:
  if (local_278 == 0) {
LAB_00106c9b:
    local_4 = 0;
    local_278 = 1;
  }
LAB_00106cb1:
  anon_unknown.dwarf_2ebd::InputSourcePreprocessing::~InputSourcePreprocessing
            ((InputSourcePreprocessing *)0x106cbe);
  sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x106ccb);
LAB_00106ce9:
  std::ifstream::~ifstream(local_1f38);
LAB_00106d07:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffd010);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_past_frame(kDefaultNumPastFrame);
  InputFormats input_format(kDefaultInputFormat);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);
  Modes mode(kDefaultMode);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:s:q:d:D:r:R:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &num_past_frame) ||
            num_past_frame < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'R': {
        const int min(0);
        const int max(static_cast<int>(kNumModes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -R option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        mode = static_cast<Modes>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int static_size(num_order + 1);
  const int read_size(2 * static_size *
                      static_cast<int>(window_coefficients.size() + 1));
  sptk::InputSourceFromStream input_source(false, read_size, &input_stream);
  InputSourcePreprocessing preprocessed_source(input_format, &input_source);

  if (kRecursive == mode) {
    if (is_magic_number_specified) {
      std::ostringstream error_message;
      error_message << "Magic number is not supported on recursive mode";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    sptk::RecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, num_past_frame, window_coefficients, &preprocessed_source);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                       "RecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<double> smoothed_static_parameters(static_size);
    while (generation.Get(&smoothed_static_parameters)) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters,
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  } else if (kNonrecursive == mode) {
    sptk::NonrecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, window_coefficients, is_magic_number_specified,
        magic_number);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                    << "NonrecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<std::vector<double> > mean_vectors;
    std::vector<std::vector<double> > variance_vectors;
    {
      const int size(input_source.GetSize() / 2);
      std::vector<double> tmp;
      while (input_source.Get(&tmp)) {
        mean_vectors.push_back(
            std::vector<double>(tmp.begin(), tmp.begin() + size));
        variance_vectors.push_back(
            std::vector<double>(tmp.begin() + size, tmp.end()));
      }
    }

    std::vector<std::vector<double> > smoothed_static_parameters;
    if (!generation.Run(mean_vectors, variance_vectors,
                        &smoothed_static_parameters)) {
      std::ostringstream error_message;
      error_message << "Failed to perform MLPG";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    const int sequence_length(
        static_cast<int>(smoothed_static_parameters.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  }

  return 0;
}